

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void preserveExpr(IdxExprTrans *pTrans,Expr *pExpr)

{
  WhereInfo *pWVar1;
  char cVar2;
  u8 uVar3;
  undefined1 uVar4;
  u32 uVar5;
  WhereExprMod *pWVar6;
  long lVar7;
  Expr *pEVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (pTrans->db == (sqlite3 *)0x0) {
    pWVar6 = (WhereExprMod *)sqlite3Malloc(0x58);
  }
  else {
    pWVar6 = (WhereExprMod *)sqlite3DbMallocRawNN(pTrans->db,0x58);
  }
  if (pWVar6 != (WhereExprMod *)0x0) {
    pWVar1 = pTrans->pWInfo;
    pWVar6->pNext = pWVar1->pExprMods;
    pWVar1->pExprMods = pWVar6;
    pWVar6->pExpr = pExpr;
    pEVar8 = &pWVar6->orig;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      cVar2 = pExpr->affExpr;
      uVar3 = pExpr->op2;
      uVar4 = pExpr->field_0x3;
      uVar5 = pExpr->flags;
      pEVar8->op = pExpr->op;
      pEVar8->affExpr = cVar2;
      pEVar8->op2 = uVar3;
      pEVar8->field_0x3 = uVar4;
      pEVar8->flags = uVar5;
      pExpr = (Expr *)((long)pExpr + ((ulong)bVar9 * -2 + 1) * 8);
      pEVar8 = (Expr *)((long)pEVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
  }
  return;
}

Assistant:

static void preserveExpr(IdxExprTrans *pTrans, Expr *pExpr){
  WhereExprMod *pNew;
  pNew = sqlite3DbMallocRaw(pTrans->db, sizeof(*pNew));
  if( pNew==0 ) return;
  pNew->pNext = pTrans->pWInfo->pExprMods;
  pTrans->pWInfo->pExprMods = pNew;
  pNew->pExpr = pExpr;
  memcpy(&pNew->orig, pExpr, sizeof(*pExpr));
}